

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O3

void glist_sort(_glist *x)

{
  bool bVar1;
  _glist *p_Var2;
  _class *p_Var3;
  t_gobj *ptVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  uint uVar5;
  t_scalar *x_00;
  float fVar6;
  float fVar7;
  t_float x1;
  t_float y1;
  float local_44;
  _glist *local_40;
  t_float local_34;
  
  x_00 = (t_scalar *)x->gl_list;
  if (x_00 != (t_scalar *)0x0) {
    uVar5 = 0;
    bVar1 = false;
    p_Var3 = scalar_class;
    fVar7 = -1e+37;
    local_40 = x;
    do {
      fVar6 = 0.0;
      if ((x_00->sc_gobj).g_pd == p_Var3) {
        scalar_getbasexy(x_00,&local_44,&local_34);
        p_Var3 = scalar_class;
        in_RDX = extraout_RDX;
        fVar6 = local_44;
      }
      p_Var2 = local_40;
      if (fVar6 < fVar7) {
        bVar1 = true;
      }
      uVar5 = uVar5 + 1;
      x_00 = (t_scalar *)(x_00->sc_gobj).g_next;
      fVar7 = fVar6;
    } while (x_00 != (t_scalar *)0x0);
    if (bVar1) {
      ptVar4 = glist_dosort((_glist *)local_40->gl_list,(t_gobj *)(ulong)uVar5,(int)in_RDX);
      p_Var2->gl_list = ptVar4;
    }
  }
  return;
}

Assistant:

void glist_sort(t_glist *x)
{
    int nitems = 0, foo = 0;
    t_float lastx = -1e37;
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_float x1 = gobj_getxforsort(g);
        if (x1 < lastx)
            foo = 1;
        lastx = x1;
        nitems++;
    }
    if (foo)
        x->gl_list = glist_dosort(x, x->gl_list, nitems);
}